

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirements
          (TrimCapabilitiesPass *this,Instruction *instruction,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  Op opcode;
  pointer pOVar1;
  pointer pOVar2;
  Operand *operand;
  undefined8 extraout_RDX;
  uint32_t i;
  uint32_t index;
  type it;
  _Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
  _Var4;
  pair<std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>_>
  pVar5;
  undefined1 auVar6 [16];
  optional<spv::Capability> result;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  _Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
  _Var3;
  
  opcode = instruction->opcode_;
  if ((opcode != OpExtension) && (opcode != OpCapability)) {
    if (opcode == OpExtInst) {
      addInstructionRequirementsForExtInst(this,instruction,capabilities);
    }
    else {
      addInstructionRequirementsForOpcode(this,opcode,capabilities,extensions);
    }
    pOVar1 = (instruction->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pOVar2 = (instruction->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (index = 0; (uint32_t)(((long)pOVar1 - (long)pOVar2) / 0x30) != index; index = index + 1) {
      operand = Instruction::GetOperand(instruction,index);
      addInstructionRequirementsForOperand(this,operand,capabilities,extensions);
    }
    local_50.first.set_._0_4_ = instruction->opcode_;
    pVar5 = std::
            _Hashtable<spv::Op,_std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_std::allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ClassEnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(&(this->opcodeHandlers_)._M_h,(key_type *)&local_50);
    _Var3 = pVar5.second.
            super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
            ._M_cur;
    while( true ) {
      _Var4._M_cur = (__node_type *)
                     pVar5.first.
                     super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                     ._M_cur;
      if ((_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
           )_Var4._M_cur ==
          _Var3.
          super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
          ._M_cur) break;
      auVar6 = (**(code **)((long)&((_Var4._M_cur)->
                                   super__Hash_node_value<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>
                                   ._M_storage._M_storage + 8))(instruction);
      result.super__Optional_base<spv::Capability,_true,_true>._M_payload.
      super__Optional_payload_base<spv::Capability> = auVar6._0_8_;
      if (((ulong)result.super__Optional_base<spv::Capability,_true,_true>._M_payload.
                  super__Optional_payload_base<spv::Capability> >> 0x20 & 1) != 0) {
        EnumSet<spv::Capability>::insert(&local_50,capabilities,(Capability *)&result);
        auVar6._8_8_ = extraout_RDX;
        auVar6._0_8_ = result.super__Optional_base<spv::Capability,_true,_true>._M_payload.
                       super__Optional_payload_base<spv::Capability>;
      }
      result.super__Optional_base<spv::Capability,_true,_true>._M_payload.
      super__Optional_payload_base<spv::Capability> = auVar6._0_8_;
      pVar5.second.
      super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                 )(__node_type *)auVar6._8_8_;
      pVar5.first.
      super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                 )(_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                   )((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirements(
    Instruction* instruction, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // Ignoring OpCapability and OpExtension instructions.
  if (instruction->opcode() == spv::Op::OpCapability ||
      instruction->opcode() == spv::Op::OpExtension) {
    return;
  }

  if (instruction->opcode() == spv::Op::OpExtInst) {
    addInstructionRequirementsForExtInst(instruction, capabilities);
  } else {
    addInstructionRequirementsForOpcode(instruction->opcode(), capabilities,
                                        extensions);
  }

  // Second case: one of the opcode operand is gated by a capability.
  const uint32_t operandCount = instruction->NumOperands();
  for (uint32_t i = 0; i < operandCount; i++) {
    addInstructionRequirementsForOperand(instruction->GetOperand(i),
                                         capabilities, extensions);
  }

  // Last case: some complex logic needs to be run to determine capabilities.
  auto[begin, end] = opcodeHandlers_.equal_range(instruction->opcode());
  for (auto it = begin; it != end; it++) {
    const OpcodeHandler handler = it->second;
    auto result = handler(instruction);
    if (!result.has_value()) {
      continue;
    }

    capabilities->insert(*result);
  }
}